

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uciengine.cpp
# Opt level: O2

string * __thiscall
banksia::UciEngine::getPositionString_abi_cxx11_
          (string *__return_storage_ptr__,UciEngine *this,Move *pondermove)

{
  ChessBoard *pCVar1;
  pointer pHVar2;
  bool bVar3;
  Hist *hist;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  bVar3 = BoardCore::fromOriginPosition
                    (&((this->super_EngineProfile).super_Engine.super_Player.board)->super_BoardCore
                    );
  if (bVar3) {
    std::__cxx11::string::string((string *)&local_90,"startpos",(allocator *)&local_50);
  }
  else {
    BoardCore::getStartingFen_abi_cxx11_
              (&local_50,
               &((this->super_EngineProfile).super_Engine.super_Player.board)->super_BoardCore);
    std::operator+(&local_90,"fen ",&local_50);
  }
  std::operator+(__return_storage_ptr__,"position ",&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (!bVar3) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  pCVar1 = (this->super_EngineProfile).super_Engine.super_Player.board;
  if ((pCVar1->super_BoardCore).histList.
      super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pCVar1->super_BoardCore).histList.
      super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pCVar1 = (this->super_EngineProfile).super_Engine.super_Player.board;
    pHVar2 = (pCVar1->super_BoardCore).histList.
             super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (pCVar1->super_BoardCore).histList.
                   super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
                   super__Vector_impl_data._M_start; this_00 != pHVar2; this_00 = this_00 + 1) {
      Move::toCoordinateString_abi_cxx11_(&local_70,(Move *)this_00);
      std::operator+(&local_90," ",&local_70);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  if ((uint)(pondermove->dest | pondermove->from) < 0x40 && pondermove->from != pondermove->dest) {
    pCVar1 = (this->super_EngineProfile).super_Engine.super_Player.board;
    if ((pCVar1->super_BoardCore).histList.
        super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pCVar1->super_BoardCore).histList.
        super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    Move::toCoordinateString_abi_cxx11_(&local_70,pondermove);
    std::operator+(&local_90," ",&local_70);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UciEngine::getPositionString(const Move& pondermove) const
{
    assert(board);
    
    std::string str = "position " + (board->fromOriginPosition() ? "startpos" : ("fen " + board->getStartingFen()));
    
    if (!board->histList.empty()) {
        str += " moves";
        for(auto && hist : board->histList) {
            str += " " + hist.move.toCoordinateString();
        }
    }
    
    if (pondermove.isValid()) {
        if (board->histList.empty()) {
            str += " moves";
        }
        str += " " + pondermove.toCoordinateString();
    }
    return str;
}